

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>::
register_coop(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
              *this,coop_unique_ptr_t *coop)

{
  unique_ptr<so_5::coop_t,_so_5::coop_deleter_t> local_20;
  coop_unique_ptr_t *local_18;
  coop_unique_ptr_t *coop_local;
  env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::real_activity_tracker_t>
  *this_local;
  
  local_18 = coop;
  coop_local = (coop_unique_ptr_t *)this;
  std::unique_ptr<so_5::coop_t,_so_5::coop_deleter_t>::unique_ptr(&local_20,coop);
  so_5::impl::coop_repository_basis_t::register_coop
            (&(this->m_coop_repo).super_coop_repository_basis_t,&local_20);
  std::unique_ptr<so_5::coop_t,_so_5::coop_deleter_t>::~unique_ptr(&local_20);
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::register_coop(
	coop_unique_ptr_t coop )
	{
		m_coop_repo.register_coop( std::move(coop) );
	}